

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAlloc(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *pPVar1;
  DataLayout *DL;
  uint64_t uVar2;
  PSNodesSeq *pPVar3;
  PSNode *node;
  
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
  node = (PSNode *)0x0;
  if (pPVar1->type == ALLOC) {
    node = pPVar1;
  }
  if ((Inst != (Instruction *)0x0) && (Inst[0x10] == (Instruction)0x3a)) {
    DL = (DataLayout *)llvm::Module::getDataLayout();
    uVar2 = llvmutils::getAllocatedSize((AllocaInst *)Inst,DL);
    (node->super_SubgraphNode<dg::pta::PSNode>).size = uVar2;
  }
  pPVar3 = addNode(this,(Value *)Inst,node);
  return pPVar3;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAlloc(const llvm::Instruction *Inst) {
    PSNodeAlloc *node = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());

    const llvm::AllocaInst *AI = llvm::dyn_cast<llvm::AllocaInst>(Inst);
    if (AI)
        node->setSize(llvmutils::getAllocatedSize(AI, &M->getDataLayout()));

    return addNode(Inst, node);
}